

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseWhileExpr(Parser *this)

{
  long lVar1;
  CompileContext *pCVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer *__ptr;
  string *in_RSI;
  size_type __dnew;
  undefined1 local_98 [16];
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  pointer local_70;
  char local_68 [24];
  undefined4 local_50;
  char *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  undefined8 uStack_30;
  int local_28;
  undefined2 local_24;
  
  local_50 = *(undefined4 *)&in_RSI[5].field_2;
  lVar1 = *(long *)((long)&in_RSI[5].field_2 + 8);
  local_48 = local_40._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,lVar1,in_RSI[6]._M_dataplus._M_p + lVar1);
  local_24 = *(undefined2 *)((long)&in_RSI[6].field_2 + 0xc);
  local_28 = *(int *)((long)&in_RSI[6].field_2 + 8);
  parseExpr((Parser *)(local_98 + 8));
  local_88._M_p = (pointer)0x2c;
  local_80._M_allocated_capacity = (size_type)&local_70;
  local_80._M_allocated_capacity =
       std::__cxx11::string::_M_create(&local_80._M_allocated_capacity,(ulong)&local_88);
  local_70 = local_88._M_p;
  builtin_strncpy((char *)(local_80._M_allocated_capacity + 0x1c),"while lo",8);
  builtin_strncpy((char *)(local_80._M_allocated_capacity + 0x24),"op body.",8);
  *(undefined8 *)(local_80._M_allocated_capacity + 0x10) = 0x66656220273e3d27;
  *(undefined8 *)(local_80._M_allocated_capacity + 0x18) = 0x6c6968772065726f;
  *(undefined8 *)local_80._M_allocated_capacity = 0x6465746365707845;
  *(undefined8 *)(local_80._M_allocated_capacity + 8) = 0x20726f20277b2720;
  local_80._8_8_ = local_88._M_p;
  *(char *)(local_80._M_allocated_capacity + (long)local_88._M_p) = '\0';
  expectBlock((Parser *)local_98,in_RSI);
  if ((pointer *)local_80._M_allocated_capacity != &local_70) {
    operator_delete((void *)local_80._M_allocated_capacity,(ulong)(local_70 + 1));
  }
  pCVar2 = (CompileContext *)operator_new(0x48);
  if (local_48 == local_40._M_local_buf + 8) {
    local_68._8_8_ = uStack_30;
    local_48 = local_68;
  }
  (pCVar2->m_source)._M_dataplus._M_p = (pointer)&PTR__WhileExpr_001272d8;
  (pCVar2->m_source)._M_string_length = local_98._8_8_;
  (pCVar2->m_source).field_2._M_allocated_capacity = local_98._0_8_;
  *(undefined4 *)((long)&(pCVar2->m_source).field_2 + 8) = local_50;
  paVar3 = &(pCVar2->m_options).m_filename.field_2;
  (pCVar2->m_options).m_filename._M_dataplus._M_p = (pointer)paVar3;
  if (local_48 == local_68) {
    paVar3->_M_allocated_capacity = local_40._8_8_;
    *(undefined8 *)((long)&(pCVar2->m_options).m_filename.field_2 + 8) = local_68._8_8_;
  }
  else {
    (pCVar2->m_options).m_filename._M_dataplus._M_p = local_48;
    (pCVar2->m_options).m_filename.field_2._M_allocated_capacity = local_40._8_8_;
  }
  (pCVar2->m_options).m_filename._M_string_length = local_40._M_allocated_capacity;
  *(int *)&(pCVar2->m_options).m_programArgs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start = local_28;
  *(undefined2 *)
   ((long)&(pCVar2->m_options).m_programArgs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = local_24;
  this->m_context = pCVar2;
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseWhileExpr() {
        Token keyword = m_previous;

        std::unique_ptr<Expr> condition = parseExpr();
        std::unique_ptr<BlockExpr> body = expectBlock("Expected '{' or '=>' before while loop body.");

        return std::make_unique<WhileExpr>(std::move(condition), std::move(body), std::move(keyword));
    }